

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Own<kj::_::AttachmentPromiseNode<kj::String>,_kj::_::PromiseDisposer>::dispose
          (Own<kj::_::AttachmentPromiseNode<kj::String>,_kj::_::PromiseDisposer> *this)

{
  AttachmentPromiseNode<kj::String> *node;
  
  node = this->ptr;
  if (node != (AttachmentPromiseNode<kj::String> *)0x0) {
    this->ptr = (AttachmentPromiseNode<kj::String> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      StaticDisposer::dispose(ptrCopy);
    }
  }